

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QString,QStringBuilder<QLatin1String,QString&>>
                    (QList<QString> *vector,QStringBuilder<QLatin1String,_QString_&> *u,
                    qsizetype from)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  qsizetype qVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  QString *s1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (vector->d).size;
  uVar5 = from;
  if (from < 0) {
    uVar5 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar5 = 0;
    }
  }
  qVar4 = -1;
  if (uVar5 < uVar1) {
    s1 = (vector->d).ptr + uVar5;
    lVar6 = uVar1 * 0x18 + uVar5 * -0x18;
    lVar2 = 0x18 - (long)s1;
    do {
      lVar7 = lVar2;
      if (lVar6 == 0) {
        qVar4 = -1;
        goto LAB_0029b9a1;
      }
      QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>((QString *)&local_50,u);
      bVar3 = ::comparesEqual(s1,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      s1 = s1 + 1;
      lVar6 = lVar6 + -0x18;
      lVar2 = lVar7 + -0x18;
    } while (!bVar3);
    qVar4 = -((long)&(vector->d).ptr[-1].d.d + lVar7) / 0x18;
  }
LAB_0029b9a1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar4;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}